

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getEnormousString
          (TestMoreStuffImpl *this,GetEnormousStringContext context)

{
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,_capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>
  local_70;
  Builder local_68;
  Maybe<capnp::MessageSize> local_50;
  Builder local_38;
  
  local_50.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,_capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>
  ::getResults(&local_38,&local_70,&local_50);
  capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults::Builder::initStr
            (&local_68,&local_38,100000000);
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getEnormousString(GetEnormousStringContext context) {
  context.getResults().initStr(100000000);  // 100MB
  return kj::READY_NOW;
}